

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

void keccak_accumulate(keccak_state *s,void *vdata,size_t len)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint64_t *puVar4;
  keccak_state *pkVar5;
  uint y;
  ulong __n;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  uint x_1;
  size_t sVar9;
  long lVar10;
  ulong *puVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  undefined1 *puVar15;
  uint (*pauVar16) [5];
  size_t sVar17;
  ulong *puVar18;
  anon_union_200_2_9472fc22 u;
  ulong local_f8 [10];
  undefined1 local_a8 [120];
  
  sVar17 = s->bytes_got;
  __n = s->bytes_wanted - sVar17;
  if (__n <= len) {
    sVar9 = 0;
    sVar14 = sVar17;
    do {
      memcpy(s->bytes + sVar14,vdata,__n);
      len = len - __n;
      lVar6 = 0;
      uVar8 = 0;
      pkVar5 = s;
      do {
        lVar10 = 0;
        do {
          if (s->bytes_wanted <= uVar8) break;
          puVar4 = pkVar5->A[0] + lVar10;
          *puVar4 = *puVar4 ^ *(ulong *)(s->bytes + uVar8);
          uVar8 = uVar8 + 8;
          lVar10 = lVar10 + 5;
        } while (lVar10 != 0x19);
        lVar6 = lVar6 + 1;
        pkVar5 = (keccak_state *)(pkVar5->A[0] + 1);
      } while (lVar6 != 5);
      lVar6 = 0;
      do {
        lVar10 = 0;
        puVar4 = s->A[0] + 4;
        do {
          local_f8[lVar10] =
               puVar4[-1] ^ puVar4[-3] ^ puVar4[-2] ^ (*(uint64_t (*) [5])(puVar4 + -4))[0] ^
               *puVar4;
          lVar10 = lVar10 + 1;
          puVar4 = puVar4 + 5;
        } while (lVar10 != 5);
        pkVar5 = s;
        sVar17 = 0;
        do {
          sVar7 = sVar17 + 1;
          sVar14 = sVar7;
          if (sVar7 == 5) {
            sVar14 = sVar9;
          }
          uVar8 = local_f8[sVar14];
          uVar12 = (ulong)((int)sVar17 - 1);
          if (sVar17 == 0) {
            uVar12 = 4;
          }
          uVar12 = local_f8[uVar12];
          lVar10 = 0;
          do {
            puVar4 = pkVar5->A[0] + lVar10;
            *puVar4 = *puVar4 ^ (uVar8 << 1 | (ulong)((long)uVar8 < 0)) ^ uVar12;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 5);
          pkVar5 = (keccak_state *)(pkVar5->A + 1);
          sVar17 = sVar7;
        } while (sVar7 != 5);
        pauVar16 = rotation_counts;
        uVar8 = 0;
        puVar11 = local_f8;
        lVar10 = 0;
        pkVar5 = s;
        do {
          lVar13 = 0;
          uVar12 = uVar8;
          puVar18 = puVar11;
          do {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar12;
            uVar1 = pkVar5->A[0][lVar13];
            bVar3 = (byte)(*pauVar16)[lVar13] & 0x3f;
            *(ulong *)((long)puVar18 +
                      (SUB168(auVar2 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8U) *
                      -5) = uVar1 << bVar3 | uVar1 >> 0x40 - bVar3;
            lVar13 = lVar13 + 1;
            puVar18 = puVar18 + 8;
            uVar12 = uVar12 + 3;
          } while (lVar13 != 5);
          lVar10 = lVar10 + 1;
          puVar11 = puVar11 + 2;
          uVar8 = uVar8 + 2;
          pauVar16 = pauVar16 + 1;
          pkVar5 = (keccak_state *)(pkVar5->A + 1);
        } while (lVar10 != 5);
        uVar8 = 2;
        puVar11 = local_f8;
        puVar15 = local_a8;
        sVar17 = 0;
        pkVar5 = s;
        do {
          sVar17 = sVar17 + 1;
          sVar14 = sVar17;
          if (sVar17 == 5) {
            sVar14 = sVar9;
          }
          lVar10 = 0;
          do {
            *(ulong *)((long)pkVar5->A[0] + lVar10) =
                 ~*(ulong *)((long)local_f8 + lVar10 + sVar14 * 0x28) &
                 *(ulong *)(puVar15 + lVar10 + (uVar8 / 5) * -200) ^
                 *(ulong *)((long)puVar11 + lVar10);
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x28);
          pkVar5 = (keccak_state *)(pkVar5->A + 1);
          puVar15 = puVar15 + 0x28;
          uVar8 = uVar8 + 1;
          puVar11 = puVar11 + 5;
        } while (sVar17 != 5);
        s->A[0][0] = s->A[0][0] ^ round_constants[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x18);
      vdata = (void *)((long)vdata + __n);
      smemclr(local_f8,200);
      s->bytes_got = 0;
      __n = s->bytes_wanted;
      sVar14 = 0;
      sVar17 = sVar9;
    } while (__n <= len);
  }
  memcpy(s->bytes + sVar17,vdata,len);
  s->bytes_got = s->bytes_got + len;
  return;
}

Assistant:

static void keccak_accumulate(keccak_state *s, const void *vdata, size_t len)
{
    const unsigned char *data = (const unsigned char *)vdata;

    while (len >= s->bytes_wanted - s->bytes_got) {
        size_t b = s->bytes_wanted - s->bytes_got;
        memcpy(s->bytes + s->bytes_got, data, b);
        len -= b;
        data += b;

        size_t n = 0;
        for (unsigned y = 0; y < 5; y++) {
            for (unsigned x = 0; x < 5; x++) {
                if (n >= s->bytes_wanted)
                    break;

                s->A[x][y] ^= GET_64BIT_LSB_FIRST(s->bytes + n);
                n += 8;
            }
        }
        keccak_transform(s->A);

        s->bytes_got = 0;
    }

    memcpy(s->bytes + s->bytes_got, data, len);
    s->bytes_got += len;
}